

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

size_t tcache_salloc(tsdn_t *tsdn,void *ptr)

{
  ulong uVar1;
  ulong uVar2;
  ulong in_RSI;
  long in_RDI;
  szind_t szind;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm;
  uint8_t state;
  rtree_leaf_elm_t *elm_1;
  uintptr_t bits;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  void *result;
  size_t ret;
  undefined1 in_stack_fffffffffffffc36;
  undefined1 in_stack_fffffffffffffc37;
  uintptr_t in_stack_fffffffffffffc38;
  rtree_ctx_t *in_stack_fffffffffffffc40;
  rtree_t *in_stack_fffffffffffffc48;
  tsdn_t *in_stack_fffffffffffffc50;
  rtree_ctx_t *local_258;
  uint local_16c;
  rtree_leaf_elm_t *local_110;
  ushort uStack_2a;
  int local_14;
  
  local_258 = (rtree_ctx_t *)&stack0xfffffffffffffc08;
  if (in_RDI == 0) {
    rtree_ctx_data_init(local_258);
  }
  else {
    local_258 = (rtree_ctx_t *)(in_RDI + 0x30);
  }
  uVar1 = in_RSI >> 0x1e & 0xf;
  uVar2 = in_RSI & 0xffffffffc0000000;
  if (local_258->cache[uVar1].leafkey == uVar2) {
    local_110 = local_258->cache[uVar1].leaf + (in_RSI >> 0xc & 0x3ffff);
  }
  else if (local_258->l2_cache[0].leafkey == uVar2) {
    local_110 = local_258->l2_cache[0].leaf;
    local_258->l2_cache[0].leafkey = local_258->cache[uVar1].leafkey;
    local_258->l2_cache[0].leaf = local_258->cache[uVar1].leaf;
    local_258->cache[uVar1].leafkey = uVar2;
    local_258->cache[uVar1].leaf = local_110;
    local_110 = local_110 + (in_RSI >> 0xc & 0x3ffff);
  }
  else {
    for (local_16c = 1; local_16c < 8; local_16c = local_16c + 1) {
      if (local_258->l2_cache[local_16c].leafkey == uVar2) {
        local_110 = local_258->l2_cache[local_16c].leaf;
        if (local_16c == 0) {
          local_258->l2_cache[0].leafkey = local_258->cache[uVar1].leafkey;
          local_258->l2_cache[0].leaf = local_258->cache[uVar1].leaf;
        }
        else {
          local_258->l2_cache[local_16c].leafkey = local_258->l2_cache[local_16c - 1].leafkey;
          local_258->l2_cache[local_16c].leaf = local_258->l2_cache[local_16c - 1].leaf;
          local_258->l2_cache[local_16c - 1].leafkey = local_258->cache[uVar1].leafkey;
          local_258->l2_cache[local_16c - 1].leaf = local_258->cache[uVar1].leaf;
        }
        local_258->cache[uVar1].leafkey = uVar2;
        local_258->cache[uVar1].leaf = local_110;
        local_110 = local_110 + (in_RSI >> 0xc & 0x3ffff);
        goto LAB_00264eff;
      }
    }
    local_110 = rtree_leaf_elm_lookup_hard
                          (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                           (_Bool)in_stack_fffffffffffffc37,(_Bool)in_stack_fffffffffffffc36);
  }
LAB_00264eff:
  switch(0x265059) {
  case 0:
    local_14 = 0;
    break;
  case 1:
    local_14 = 2;
  }
  if (local_14 - 1U < 2) {
    uStack_2a = (ushort)((ulong)(local_110->le_bits).repr >> 0x30);
  }
  else if (local_14 == 5) {
    uStack_2a = (ushort)((ulong)(local_110->le_bits).repr >> 0x30);
  }
  else {
    uStack_2a = (ushort)((ulong)(local_110->le_bits).repr >> 0x30);
  }
  return sz_index2size_tab[uStack_2a];
}

Assistant:

size_t
tcache_salloc(tsdn_t *tsdn, const void *ptr) {
	return arena_salloc(tsdn, ptr);
}